

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind6-error.c
# Opt level: O0

int run_test_tcp_bind6_error_addrinuse(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_218 [4];
  int r;
  uv_tcp_t server2;
  uv_tcp_t server1;
  sockaddr_in6 addr;
  
  iVar1 = can_ipv6();
  if (iVar1 == 0) {
    fprintf(_stderr,"%s\n","IPv6 not supported");
    fflush(_stderr);
    addr.sin6_addr.__in6_u.__u6_addr32[3] = 1;
  }
  else {
    iVar1 = uv_ip6_addr("::",0x23a3,&server1.queued_fds);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x2d,"0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)");
      abort();
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server2.queued_fds);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x30,"r == 0");
      abort();
    }
    iVar1 = uv_tcp_bind(&server2.queued_fds,&server1.queued_fds,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x32,"r == 0");
      abort();
    }
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,local_218);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x35,"r == 0");
      abort();
    }
    iVar1 = uv_tcp_bind(local_218,&server1.queued_fds,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x37,"r == 0");
      abort();
    }
    iVar1 = uv_listen(&server2.queued_fds,0x80,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x3a,"r == 0");
      abort();
    }
    iVar1 = uv_listen(local_218,0x80,0);
    if (iVar1 != -0x62) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x3c,"r == UV_EADDRINUSE");
      abort();
    }
    uv_close(&server2.queued_fds,close_cb);
    uv_close(local_218,close_cb);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (close_cb_called != 2) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x43,"close_cb_called == 2");
      abort();
    }
    loop = (uv_loop_t *)uv_default_loop();
    close_loop(loop);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind6-error.c"
              ,0x45,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    addr.sin6_addr.__in6_u.__u6_addr32[3] = 0;
  }
  return addr.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

TEST_IMPL(tcp_bind6_error_addrinuse) {
  struct sockaddr_in6 addr;
  uv_tcp_t server1, server2;
  int r;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server1);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server1, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &server2);
  ASSERT(r == 0);
  r = uv_tcp_bind(&server2, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)&server1, 128, NULL);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server2, 128, NULL);
  ASSERT(r == UV_EADDRINUSE);

  uv_close((uv_handle_t*)&server1, close_cb);
  uv_close((uv_handle_t*)&server2, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}